

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpsocketengine.cpp
# Opt level: O3

bool __thiscall
QHttpSocketEngine::waitForReadOrWrite
          (QHttpSocketEngine *this,bool *readyToRead,bool *readyToWrite,bool checkRead,
          bool checkWrite,QDeadlineTimer deadline,bool *timedOut)

{
  undefined1 uVar1;
  undefined3 in_register_00000081;
  
  if (CONCAT31(in_register_00000081,checkWrite) == 0) {
    uVar1 = (**(code **)(*(long *)this + 0x120))(this,deadline.t1,deadline._8_8_,timedOut);
    readyToWrite = readyToRead;
    if (readyToRead == (bool *)0x0) {
      return (bool)uVar1;
    }
  }
  else {
    uVar1 = (**(code **)(*(long *)this + 0x128))();
    if (readyToWrite == (bool *)0x0) {
      return (bool)uVar1;
    }
  }
  *readyToWrite = (bool)uVar1;
  return (bool)uVar1;
}

Assistant:

bool QHttpSocketEngine::waitForReadOrWrite(bool *readyToRead, bool *readyToWrite,
                                           bool checkRead, bool checkWrite,
                                           QDeadlineTimer deadline, bool *timedOut)
{
    Q_UNUSED(checkRead);

    if (!checkWrite) {
        // Not interested in writing? Then we wait for read notifications.
        bool canRead = waitForRead(deadline, timedOut);
        if (readyToRead)
            *readyToRead = canRead;
        return canRead;
    }

    // Interested in writing? Then we wait for write notifications.
    bool canWrite = waitForWrite(deadline, timedOut);
    if (readyToWrite)
        *readyToWrite = canWrite;
    return canWrite;
}